

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O2

void __thiscall
ParserTest_LogicalExpression_Test::~ParserTest_LogicalExpression_Test
          (ParserTest_LogicalExpression_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTest, LogicalExpression)
{
  auto node = 
    std::make_unique<BinaryOpNode>(
      std::make_unique<BinaryOpNode>(
        std::make_unique<NumericLiteralNode>(2),
        BinaryOperator::GreaterEq,
        std::make_unique<NumericLiteralNode>(5)),
      BinaryOperator::LogicalAnd,
      std::make_unique<BinaryOpNode>(
        std::make_unique<NumericLiteralNode>(2),
        BinaryOperator::Equal,
        std::make_unique<NumericLiteralNode>(2)));
  setupTest("2 >= 5 && 2 == 2", &Parser::parseLogicalExpression, std::move(node));

  node = 
    std::make_unique<BinaryOpNode>(
      std::make_unique<BinaryOpNode>(
        std::make_unique<BinaryOpNode>(
          std::make_unique<NumericLiteralNode>(2),
          BinaryOperator::LessEq,
          std::make_unique<NumericLiteralNode>(5)),
        BinaryOperator::LogicalOr,
        std::make_unique<BinaryOpNode>(
          std::make_unique<NumericLiteralNode>(2),
          BinaryOperator::Equal,
          std::make_unique<NumericLiteralNode>(2))),
      BinaryOperator::LogicalAnd,
      std::make_unique<BinaryOpNode>(
        std::make_unique<NumericLiteralNode>(4),
        BinaryOperator::Greater,
        std::make_unique<NumericLiteralNode>(2)));
  setupTest("2 <= 5 || 2 == 2 && 4 > 2", &Parser::parseLogicalExpression, std::move(node));
}